

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreateSharedResourcesTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  TestStatus *pTVar1;
  deUint32 maxResourceConsumers_;
  CreateThread<vkt::api::(anonymous_namespace)::ComputePipeline> *this;
  Parameters *extraout_RDX;
  bool bVar2;
  ThreadGroup threads;
  Environment env;
  Resources res;
  Parameters local_151;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_150;
  TestStatus *local_140;
  ThreadGroup local_138;
  Environment local_108;
  Resources local_d0;
  
  local_140 = __return_storage_ptr__;
  maxResourceConsumers_ = getDefaultTestThreadCount();
  Environment::Environment(&local_108,context,maxResourceConsumers_);
  ComputePipeline::Resources::Resources(&local_d0,&local_108,extraout_RDX);
  ThreadGroup::ThreadGroup(&local_138);
  while (pTVar1 = local_140, bVar2 = maxResourceConsumers_ != 0,
        maxResourceConsumers_ = maxResourceConsumers_ - 1, bVar2) {
    this = (CreateThread<vkt::api::(anonymous_namespace)::ComputePipeline> *)operator_new(0x88);
    CreateThread<vkt::api::(anonymous_namespace)::ComputePipeline>::CreateThread
              (this,&local_108,&local_d0,&local_151);
    local_150.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = (ThreadGroupThread *)this;
    ThreadGroup::add(&local_138,&local_150);
    if ((CreateThread<vkt::api::(anonymous_namespace)::ComputePipeline> *)
        local_150.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (CreateThread<vkt::api::(anonymous_namespace)::ComputePipeline> *)0x0) {
      (*(((ThreadGroupThread *)
         &(local_150.
           super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
           .m_data.ptr)->super_Thread)->super_Thread)._vptr_Thread[1])();
      local_150.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
  }
  ThreadGroup::run(local_140,&local_138);
  ThreadGroup::~ThreadGroup(&local_138);
  ComputePipeline::Resources::~Resources(&local_d0);
  return pTVar1;
}

Assistant:

tcu::TestStatus multithreadedCreateSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const deUint32						numThreads	= getDefaultTestThreadCount();
	const Environment					env			(context, numThreads);
	const typename Object::Resources	res			(env, params);
	ThreadGroup							threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, res, params)));

	return threads.run();
}